

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

int __thiscall
ktx::ValidationContext::validate(ValidationContext *this,bool doCreateAndTranscodeChecks)

{
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  byte in_SIL;
  long in_RDI;
  anon_class_8_1_8991fb9c call;
  char *in_stack_fffffffffffffeb8;
  char *__str;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffec0;
  VkFormat *in_stack_fffffffffffffee0;
  offset_in_ValidationContext_to_subr *in_stack_fffffffffffffee8;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffef0;
  code *this_00;
  size_t in_stack_fffffffffffffef8;
  size_t sVar1;
  char *in_stack_ffffffffffffff00;
  char local_18 [15];
  byte local_9;
  
  local_9 = in_SIL & 1;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  __str = local_18;
  name._M_str = in_stack_ffffffffffffff00;
  name._M_len = in_stack_fffffffffffffef8;
  validate(bool)::$_0::operator()(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,name);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffec0,__str);
  name_00._M_str = in_stack_ffffffffffffff00;
  name_00._M_len = in_stack_fffffffffffffef8;
  validate(bool)::$_0::operator()(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,name_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffec0,__str);
  name_01._M_str = in_stack_ffffffffffffff00;
  name_01._M_len = in_stack_fffffffffffffef8;
  validate(bool)::$_0::operator()
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,name_01,in_stack_fffffffffffffee0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffec0,__str);
  name_02._M_str = in_stack_ffffffffffffff00;
  name_02._M_len = in_stack_fffffffffffffef8;
  validate(bool)::$_0::operator()(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,name_02);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffec0,__str);
  name_03._M_str = in_stack_ffffffffffffff00;
  name_03._M_len = in_stack_fffffffffffffef8;
  validate(bool)::$_0::operator()(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,name_03);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffec0,__str);
  name_04._M_str = in_stack_ffffffffffffff00;
  name_04._M_len = in_stack_fffffffffffffef8;
  validate(bool)::$_0::operator()(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,name_04);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffec0,__str);
  name_05._M_str = in_stack_ffffffffffffff00;
  name_05._M_len = in_stack_fffffffffffffef8;
  validate(bool)::$_0::operator()(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,name_05);
  this_00 = validatePaddings;
  sVar1 = 0;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffec0,__str);
  name_06._M_str = in_stack_ffffffffffffff00;
  name_06._M_len = sVar1;
  validate(bool)::$_0::operator()
            ((anon_class_8_1_8991fb9c *)this_00,in_stack_fffffffffffffee8,name_06);
  if ((local_9 & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffec0,__str);
    name_07._M_str = in_stack_ffffffffffffff00;
    name_07._M_len = sVar1;
    validate(bool)::$_0::operator()
              ((anon_class_8_1_8991fb9c *)this_00,in_stack_fffffffffffffee8,name_07);
  }
  return *(int *)(in_RDI + 0x2c);
}

Assistant:

int ValidationContext::validate(bool doCreateAndTranscodeChecks) {
    const auto call = [&](const auto& fn, std::string_view name, auto&&... args) {
        try {
            (this->*fn)(std::forward<decltype(args)>(args)...);
        } catch (const std::bad_alloc& ex) {
            error(System::OutOfMemory, name, ex.what());
        }
    };

    call(&ValidationContext::validateHeader, "Header");
    call(&ValidationContext::validateIndices, "Index");
    call(&ValidationContext::calculateExpectedDFD, "Expected DFD", VkFormat(header.vkFormat));
    call(&ValidationContext::validateDFD, "DFD");
    call(&ValidationContext::validateLevelIndex, "Level Index"); // Must come after the DFD parsed
    call(&ValidationContext::validateKVD, "KVD");
    call(&ValidationContext::validateSGD, "SGD");
    call(&ValidationContext::validatePaddings, "padding");
    if (doCreateAndTranscodeChecks)
        call(&ValidationContext::validateCreateAndTranscode, "Create and Transcode");

    return returnCode;
}